

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zetDebugReadEvent
          (zet_debug_session_handle_t hDebug,uint64_t timeout,zet_debug_event_t *event)

{
  zet_pfnDebugReadEvent_t pfnReadEvent;
  ze_result_t result;
  zet_debug_event_t *event_local;
  uint64_t timeout_local;
  zet_debug_session_handle_t hDebug_local;
  
  pfnReadEvent._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c968 != (code *)0x0) {
    pfnReadEvent._4_4_ = (*DAT_0011c968)(hDebug,timeout,event);
  }
  return pfnReadEvent._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetDebugReadEvent(
        zet_debug_session_handle_t hDebug,              ///< [in] debug session handle
        uint64_t timeout,                               ///< [in] if non-zero, then indicates the maximum time (in milliseconds) to
                                                        ///< yield before returning ::ZE_RESULT_SUCCESS or ::ZE_RESULT_NOT_READY;
                                                        ///< if zero, then immediately returns the status of the event;
                                                        ///< if `UINT64_MAX`, then function will not return until complete or
                                                        ///< device is lost.
                                                        ///< Due to external dependencies, timeout may be rounded to the closest
                                                        ///< value allowed by the accuracy of those dependencies.
        zet_debug_event_t* event                        ///< [in,out] a pointer to a ::zet_debug_event_t.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnReadEvent = context.zetDdiTable.Debug.pfnReadEvent;
        if( nullptr != pfnReadEvent )
        {
            result = pfnReadEvent( hDebug, timeout, event );
        }
        else
        {
            // generic implementation
        }

        return result;
    }